

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpnghandler.cpp
# Opt level: O0

void __thiscall QPngHandlerPrivate::readPngTexts(QPngHandlerPrivate *this,png_info *info)

{
  QLatin1StringView s;
  bool bVar1;
  QByteArrayView *in_RSI;
  QLatin1String *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QString value;
  QString key;
  int num_text;
  png_textp text_ptr;
  QLatin1StringView in_stack_fffffffffffffed0;
  QLatin1String *size;
  char *in_stack_fffffffffffffef0;
  QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_QString> *in_stack_fffffffffffffef8;
  QString *in_stack_ffffffffffffff00;
  storage_type *local_70;
  undefined1 local_60 [24];
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int local_14;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_14 = 0;
  size = in_RDI;
  png_get_text((char16_t *)in_RDI[5].m_size,in_RSI,&local_10,&local_14);
  while (local_14 != 0) {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_14 = local_14 + -1;
    QString::QString((QString *)0x9a85c0);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x9a85fa);
    QByteArrayView::QByteArrayView<char_*,_true>(in_RSI,(char **)in_stack_fffffffffffffed0.m_data);
    QVar2.m_data = local_70;
    QVar2.m_size = (qsizetype)local_60;
    QString::fromLatin1(QVar2);
    QString::operator=((QString *)in_stack_fffffffffffffed0.m_size,(QString *)in_RDI);
    QString::~QString((QString *)0x9a8652);
    if (*(long *)(local_10 + 0x20) == 0) {
      QString::fromLatin1(in_stack_fffffffffffffef0,(qsizetype)size);
      QString::operator=((QString *)in_stack_fffffffffffffed0.m_size,(QString *)in_RDI);
      QString::~QString((QString *)0x9a86f7);
    }
    else {
      QString::fromUtf8(in_stack_fffffffffffffef0,(qsizetype)size);
      QString::operator=((QString *)in_stack_fffffffffffffed0.m_size,(QString *)in_RDI);
      QString::~QString((QString *)0x9a86ab);
    }
    bVar1 = QString::isEmpty((QString *)0x9a8704);
    if (!bVar1) {
      in_stack_fffffffffffffed0 =
           Qt::Literals::StringLiterals::operator____L1
                     (in_stack_fffffffffffffed0.m_data,in_stack_fffffffffffffed0.m_size);
      s.m_data = (char *)size;
      s.m_size = (qsizetype)in_RSI;
      QString::operator+=((QString *)in_RDI,s);
    }
    Qt::Literals::StringLiterals::operator____L1
              (in_stack_fffffffffffffed0.m_data,in_stack_fffffffffffffed0.m_size);
    ::operator+((QString *)in_stack_fffffffffffffed0.m_size,in_RDI);
    QString::simplified((QString *)in_RDI);
    ::operator+((QStringBuilder<QString_&,_QLatin1String> *)in_stack_fffffffffffffed0.m_data,
                (QString *)in_stack_fffffffffffffed0.m_size);
    ::operator+=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_QString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_QString> *)0x9a87ae);
    QString::~QString((QString *)0x9a87b8);
    QList<QString>::append
              ((QList<QString> *)in_stack_fffffffffffffed0.m_size,(parameter_type)in_RDI);
    QList<QString>::append
              ((QList<QString> *)in_stack_fffffffffffffed0.m_size,(parameter_type)in_RDI);
    local_10 = local_10 + 0x38;
    QString::~QString((QString *)0x9a8803);
    QString::~QString((QString *)0x9a8810);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  local_14 = local_14 + -1;
  __stack_chk_fail();
}

Assistant:

void QPngHandlerPrivate::readPngTexts(png_info *info)
{
#ifndef QT_NO_IMAGEIO_TEXT_LOADING
    png_textp text_ptr;
    int num_text=0;
    png_get_text(png_ptr, info, &text_ptr, &num_text);

    while (num_text--) {
        QString key, value;
        key = QString::fromLatin1(text_ptr->key);
#if defined(PNG_iTXt_SUPPORTED)
        if (text_ptr->itxt_length) {
            value = QString::fromUtf8(text_ptr->text, int(text_ptr->itxt_length));
        } else
#endif
        {
            value = QString::fromLatin1(text_ptr->text, int(text_ptr->text_length));
        }
        if (!description.isEmpty())
            description += "\n\n"_L1;
        description += key + ": "_L1 + value.simplified();
        readTexts.append(key);
        readTexts.append(value);
        text_ptr++;
    }
#else
    Q_UNUSED(info);
#endif
}